

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall ON_BinaryArchive::Write3dmDimStyle(ON_BinaryArchive *this,ON_DimStyle *dimstyle)

{
  bool bVar1;
  ON_DimStyle *this_00;
  ON_UUID *a;
  int line_number;
  ON_DimStyle *copy_of_model_dimstyle;
  ON_DimStyle *local_38;
  ON_UUID local_30;
  
  bVar1 = ON_ModelComponent::ParentIdIsNotNil(&dimstyle->super_ON_ModelComponent);
  if ((bVar1) || (bVar1 = ON_DimStyle::HasOverrides(dimstyle), bVar1)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x2a10,"","Override dimstyles are not stored in the dimstyle table in V6 files.");
  }
  else {
    if (this->m_archive_dim_style_table_status == 2) {
      if ((this->m_archive_dim_style_table).m_count == 0) {
        line_number = 0x2a21;
LAB_003a212a:
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,line_number,"","Write3dmDimStyle() called at the incorrect time");
        return false;
      }
    }
    else if (this->m_archive_dim_style_table_status == 1) {
      if ((this->m_archive_dim_style_table).m_count != 0) {
        line_number = 0x2a18;
        goto LAB_003a212a;
      }
      this->m_archive_dim_style_table_status = 2;
    }
    this_00 = (ON_DimStyle *)operator_new(0x450);
    ON_DimStyle::ON_DimStyle(this_00,dimstyle);
    local_38 = this_00;
    Internal_Write3dmUpdateManifest(this,(ON_ModelComponent *)this_00);
    ON_SimpleArray<ON_DimStyle_*>::Append(&this->m_archive_dim_style_table,&local_38);
    if (((this->m_archive_current_dim_style == (ON_DimStyle *)0x0) &&
        (this->m_archive_3dm_settings != (ON_3dmSettings *)0x0)) &&
       (bVar1 = ON_ModelComponent::IdIsNotNil(&dimstyle->super_ON_ModelComponent), bVar1)) {
      a = ON_ModelComponent::Id(&dimstyle->super_ON_ModelComponent);
      local_30 = ON_3dmSettings::CurrentDimensionStyleId(this->m_archive_3dm_settings);
      bVar1 = ::operator==(a,&local_30);
      if (bVar1) {
        this->m_archive_current_dim_style = local_38;
      }
    }
  }
  return true;
}

Assistant:

bool ON_BinaryArchive::Write3dmDimStyle( const ON_DimStyle&  dimstyle )
{
  if ( dimstyle.ParentIdIsNotNil() || dimstyle.HasOverrides())
  {
    ON_ERROR("Override dimstyles are not stored in the dimstyle table in V6 files.");
    return true; // don't abort writing the file.
  }

  if (1 == m_archive_dim_style_table_status)
  {
    if (0 != m_archive_dim_style_table.UnsignedCount())
    {
      ON_ERROR("Write3dmDimStyle() called at the incorrect time");
      return false;
    }
    m_archive_dim_style_table_status = 2;
  }
  else if (2 == m_archive_dim_style_table_status)
  {
    if (m_archive_dim_style_table.UnsignedCount() <= 0 )
    {
      ON_ERROR("Write3dmDimStyle() called at the incorrect time");
      return false;
    }
  }

  ON_DimStyle* copy_of_model_dimstyle = new ON_DimStyle(dimstyle);
  if (nullptr != copy_of_model_dimstyle)
  {
    Internal_Write3dmUpdateManifest(*copy_of_model_dimstyle);
    m_archive_dim_style_table.Append(copy_of_model_dimstyle);
    if (nullptr == m_archive_current_dim_style)
    {
      if (nullptr != m_archive_3dm_settings)
      {
        if (dimstyle.IdIsNotNil() && dimstyle.Id() == m_archive_3dm_settings->CurrentDimensionStyleId())
          m_archive_current_dim_style = copy_of_model_dimstyle;
      }
    }
  }

  return true;
}